

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_1::Compressed2DTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Compressed2DTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  TextureFormat log;
  ParameterType *pPVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  RGBA RVar6;
  TestTexture2D *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<float,_std::allocator<float>_> texCoord;
  Texture2DView local_2f8;
  Surface referenceFrame;
  Surface rendered;
  PixelFormat local_2b8;
  IVec4 formatBitDepth;
  TextureFormat textureFormat;
  undefined1 local_284 [76];
  size_type sStack_238;
  size_type local_230;
  undefined8 uStack_228;
  int local_220;
  anon_union_16_3_1194ccdc_for_v local_21c;
  undefined8 local_20c;
  LodMode local_204;
  TextureFormatInfo formatInfo;
  undefined1 local_1b0 [32];
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [21];
  
  log = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &this->m_renderer;
  pTVar7 = util::TextureRenderer::get2DTexture(this_00,0);
  iVar3 = (*(pTVar7->super_TestTexture)._vptr_TestTexture[0xe])(pTVar7);
  textureFormat = *(TextureFormat *)CONCAT44(extraout_var,iVar3);
  tcu::getTextureFormatInfo(&formatInfo,&textureFormat);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_284,TEXTURETYPE_2D);
  dVar4 = util::TextureRenderer::getRenderWidth(this_00);
  dVar5 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&rendered,dVar4,dVar5);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar1 = this->m_testParameters;
  util::createSampler((Sampler *)local_1b0,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pPVar1->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  this_01 = (ostringstream *)(local_1b0 + 8);
  local_220 = local_190;
  local_230 = local_1b0._16_8_;
  uStack_228 = local_1b0._24_8_;
  local_284._68_8_ = local_1b0._0_8_;
  sStack_238 = local_1b0._8_8_;
  local_21c._0_8_ = local_18c[0]._0_8_;
  local_21c._8_8_ = local_18c[0]._8_8_;
  local_20c = local_18c[1]._0_8_;
  local_284._4_4_ = SAMPLERTYPE_FLOAT;
  local_204 = LODMODE_EXACT;
  local_284._52_4_ = formatInfo.lookupBias.m_data[0];
  local_284._56_4_ = formatInfo.lookupBias.m_data[1];
  local_284._60_4_ = formatInfo.lookupBias.m_data[2];
  local_284._64_4_ = formatInfo.lookupBias.m_data[3];
  local_284._36_4_ = formatInfo.lookupScale.m_data[0];
  local_284._40_4_ = formatInfo.lookupScale.m_data[1];
  local_284._44_4_ = formatInfo.lookupScale.m_data[2];
  local_284._48_4_ = formatInfo.lookupScale.m_data[3];
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::operator<<((ostream *)this_01,"Compare reference value = ");
  std::ostream::operator<<(this_01,(float)local_284._32_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  local_1b0._0_4_ = R;
  local_1b0._4_4_ = SNORM_INT8;
  referenceFrame._0_8_ = &DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)local_1b0,(Vec2 *)&referenceFrame);
  util::TextureRenderer::renderQuad
            (this_00,&rendered,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_284);
  local_1b0._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_1b0);
  local_2b8.redBits = formatBitDepth.m_data[0];
  local_2b8.greenBits = formatBitDepth.m_data[1];
  local_2b8.blueBits = formatBitDepth.m_data[2];
  local_2b8.alphaBits = formatBitDepth.m_data[3];
  dVar4 = util::TextureRenderer::getRenderWidth(this_00);
  dVar5 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&referenceFrame,dVar4,dVar5);
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_1b0,&referenceFrame,&local_2b8);
  iVar3 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  local_2f8.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar3) + 0x40);
  local_2f8.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar3) + 0x48);
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_1b0,&local_2f8,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_284);
  RVar6 = tcu::PixelFormat::getColorThreshold(&local_2b8);
  local_1b0._0_4_ = RVar6.m_value;
  local_2f8.m_numLevels = 0x1010101;
  RVar6 = tcu::operator+((RGBA *)local_1b0,(RGBA *)&local_2f8);
  bVar2 = glu::TextureTestUtil::compareImages((TestLog *)log,&referenceFrame,&rendered,RVar6);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Pass",(allocator<char> *)&local_2f8);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Image verification failed",(allocator<char> *)&local_2f8);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b0);
  }
  std::__cxx11::string::~string((string *)local_1b0);
  tcu::Surface::~Surface(&referenceFrame);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&rendered);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Compressed2DTestInstance::iterate (void)
{
	tcu::TestLog&					log				= m_context.getTestContext().getLog();
	const pipeline::TestTexture2D&	texture			= m_renderer.get2DTexture(0);
	const tcu::TextureFormat		textureFormat	= texture.getTextureFormat();
	const tcu::TextureFormatInfo	formatInfo		= tcu::getTextureFormatInfo(textureFormat);

	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	vector<float>					texCoord;

	// Setup params for reference.
	sampleParams.sampler			= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.samplerType		= SAMPLERTYPE_FLOAT;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.colorBias			= formatInfo.lookupBias;
	sampleParams.colorScale			= formatInfo.lookupScale;

	log << TestLog::Message << "Compare reference value = " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	m_renderer.renderQuad(rendered, 0, &texCoord[0], sampleParams);

	// Compute reference.
	const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
	const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
	tcu::Surface			referenceFrame	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat), m_texture->getTexture(), &texCoord[0], sampleParams);

	// Compare and log.
	const bool isOk = compareImages(log, referenceFrame, rendered, pixelFormat.getColorThreshold() + tcu::RGBA(1, 1, 1, 1));

	return isOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Image verification failed");
}